

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_New_Memory_Face(FT_Library library,FT_Byte *file_base,FT_Long file_size,
                           FT_Long face_index,FT_Face *aface)

{
  undefined1 local_78 [8];
  FT_Open_Args args;
  FT_Face *aface_local;
  FT_Long face_index_local;
  FT_Long file_size_local;
  FT_Byte *file_base_local;
  FT_Library library_local;
  
  if (file_base == (FT_Byte *)0x0) {
    library_local._4_4_ = 6;
  }
  else {
    local_78._0_4_ = 1;
    args.pathname = (FT_String *)0x0;
    args._0_8_ = file_base;
    args.memory_base = (FT_Byte *)file_size;
    args.params = (FT_Parameter *)aface;
    library_local._4_4_ =
         ft_open_face_internal(library,(FT_Open_Args *)local_78,face_index,aface,'\x01');
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Memory_Face( FT_Library      library,
                      const FT_Byte*  file_base,
                      FT_Long         file_size,
                      FT_Long         face_index,
                      FT_Face        *aface )
  {
    FT_Open_Args  args;


    /* test for valid `library' and `face' delayed to `FT_Open_Face' */
    if ( !file_base )
      return FT_THROW( Invalid_Argument );

    args.flags       = FT_OPEN_MEMORY;
    args.memory_base = file_base;
    args.memory_size = file_size;
    args.stream      = NULL;

    return ft_open_face_internal( library, &args, face_index, aface, 1 );
  }